

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O2

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RestrictLastObjVal
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  long lVar1;
  double dVar2;
  Type TVar3;
  int expr;
  pointer pQVar4;
  long lVar5;
  NLConstraint *this_00;
  LinTerms *pLVar6;
  double dVar7;
  AlgConRange rng;
  AlgConRange rng_00;
  LinTerms local_e80;
  LinTerms local_e08;
  LinTerms local_d90;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_d18;
  LinTerms local_c78;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_c00;
  NLConstraint local_b60;
  NLConstraint local_a90;
  QuadTerms local_9c0;
  QuadTerms local_880;
  QuadAndLinTerms local_740;
  QuadAndLinTerms local_588;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_3d0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> local_1f0;
  
  lVar5 = (long)this->i_current_obj_;
  lVar1 = lVar5 + -1;
  pQVar4 = (this->obj_new_).
           super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = ABS(this->objval_last_) *
          (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 + -1];
  dVar2 = (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 + -1];
  if (dVar7 <= dVar2) {
    dVar7 = dVar2;
  }
  TVar3 = pQVar4[lVar1].super_NLObjective.super_LinearObjective.sense_;
  expr = pQVar4[lVar1].super_NLObjective.expr_;
  rng_00.ub_ = dVar7 * *(double *)(&DAT_002ad120 + (ulong)(TVar3 == MAX) * 8) + this->objval_last_;
  if (expr < 0) {
    if (*(size_ty *)
         ((long)&pQVar4[lVar1].qt_.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
         + 0x10) == 0) {
      pLVar6 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
      if (TVar3 == MAX) {
        LinTerms::LinTerms(&local_c78,pLVar6);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  (&local_c00,&local_c78,rng_00.ub_,true);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    *)&this[-5].obj_new_tolr_,&local_c00);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_c00);
        pLVar6 = &local_c78;
      }
      else {
        LinTerms::LinTerms(&local_d90,pLVar6);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (&local_d18,&local_d90,(AlgConRhs<_1>)rng_00.ub_,true);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    *)&this[-5].obj_new_tolr_,&local_d18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_d18);
        pLVar6 = &local_d90;
      }
    }
    else {
      pLVar6 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
      if (TVar3 == MAX) {
        LinTerms::LinTerms(&local_e08,pLVar6);
        QuadTerms::QuadTerms(&local_880,&pQVar4[lVar1].qt_);
        QuadAndLinTerms::QuadAndLinTerms(&local_588,&local_e08,&local_880);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  (&local_1f0,&local_588,rng_00.ub_,true);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    *)&this[-5].obj_new_tolr_,&local_1f0);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  (&local_1f0);
        QuadAndLinTerms::~QuadAndLinTerms(&local_588);
        QuadTerms::~QuadTerms(&local_880);
        pLVar6 = &local_e08;
      }
      else {
        LinTerms::LinTerms(&local_e80,pLVar6);
        QuadTerms::QuadTerms(&local_9c0,&pQVar4[lVar1].qt_);
        QuadAndLinTerms::QuadAndLinTerms(&local_740,&local_e80,&local_9c0);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (&local_3d0,&local_740,(AlgConRhs<_1>)rng_00.ub_,true);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    *)&this[-5].obj_new_tolr_,&local_3d0);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  (&local_3d0);
        QuadAndLinTerms::~QuadAndLinTerms(&local_740);
        QuadTerms::~QuadTerms(&local_9c0);
        pLVar6 = &local_e80;
      }
    }
    LinTerms::~LinTerms(pLVar6);
  }
  else {
    pLVar6 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
    if (TVar3 == MAX) {
      rng.ub_ = INFINITY;
      rng.lb_ = rng_00.ub_;
      NLConstraint::NLConstraint(&local_a90,pLVar6,expr,rng,true);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AddConstraint<mp::NLConstraint>
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-5].obj_new_tolr_,&local_a90);
      this_00 = &local_a90;
    }
    else {
      rng_00.lb_ = -INFINITY;
      NLConstraint::NLConstraint(&local_b60,pLVar6,expr,rng_00,true);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AddConstraint<mp::NLConstraint>
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-5].obj_new_tolr_,&local_b60);
      this_00 = &local_b60;
    }
    NLConstraint::~NLConstraint(this_00);
  }
  return;
}

Assistant:

void RestrictLastObjVal() {
    assert(i_current_obj_ && i_current_obj_<obj_new_.size());
    const auto& obj_last = obj_new_[i_current_obj_-1];
    auto lim = objval_last_;
    auto diff = std::max(                 // Apply degradation tolerance
        obj_new_tola_[i_current_obj_-1], std::fabs(lim) * obj_new_tolr_[i_current_obj_-1]);
    lim += diff * (obj::MAX==obj_last.obj_sense() ? -1.0 : 1.0);
    if (obj_last.HasExpr()) {
      assert(obj_last.GetQPTerms().empty());   // not mixing QP and expression term
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { lim, MPCD(Inf()) } } ) );
      else
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { MPCD(MinusInf()), lim } } ) );
    } else    if (obj_last.GetQPTerms().size()) {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						QuadConGE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						QuadConLE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
    } else {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						LinConGE{ { obj_last.GetLinTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						LinConLE{ { obj_last.GetLinTerms() }, lim } ) );
    }
  }